

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O2

int Cec_ManSimCompareConst(uint *p,int nWords)

{
  uint *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = 0;
  if (0 < nWords) {
    uVar2 = (ulong)(uint)nWords;
  }
  if ((*p & 1) == 0) {
    uVar3 = 0;
    do {
      if (uVar2 == uVar3) {
        return 1;
      }
      puVar1 = p + uVar3;
      uVar3 = uVar3 + 1;
    } while (*puVar1 == 0);
  }
  else {
    uVar3 = 0;
    do {
      if (uVar2 == uVar3) {
        return 1;
      }
      puVar1 = p + uVar3;
      uVar3 = uVar3 + 1;
    } while (*puVar1 == 0xffffffff);
  }
  return 0;
}

Assistant:

int Cec_ManSimCompareConst( unsigned * p, int nWords )
{
    int w;
    if ( p[0] & 1 )
    {
        for ( w = 0; w < nWords; w++ )
            if ( p[w] != ~0 )
                return 0;
        return 1;
    }
    else
    {
        for ( w = 0; w < nWords; w++ )
            if ( p[w] != 0 )
                return 0;
        return 1;
    }
}